

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetOutputName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PositionType *pPVar2;
  pointer pcVar3;
  long lVar4;
  _Base_ptr p_Var5;
  long lVar6;
  size_type sVar7;
  _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  cmake *this_00;
  long *plVar9;
  char *pcVar10;
  size_t sVar11;
  cmListFileBacktrace *r;
  size_type *psVar12;
  long *plVar13;
  _Alloc_hider _Var14;
  pointer prop;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar15;
  string outName;
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string configUpper;
  cmGeneratorExpression ge;
  undefined1 local_c8 [32];
  string *local_a8;
  OutputNameKey key;
  value_type entry;
  
  key.first._M_dataplus._M_p = (pointer)&key.first.field_2;
  pcVar3 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&key,pcVar3,pcVar3 + config->_M_string_length)
  ;
  key.second = artifact;
  _Var8._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->OutputNameMap)._M_t,&key);
  if ((_Rb_tree_header *)_Var8._M_node == &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_&,_const_char_(&)[1],_true>
              (&entry,&key,(char (*) [1])0x674b0e);
    pVar15 = std::
             _Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
             ::
             _M_emplace_unique<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>&>
                       ((_Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
                         *)&this->OutputNameMap,&entry);
    _Var8 = pVar15.first._M_node;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar10 = GetOutputTargetType(this,artifact);
    type._M_dataplus._M_p = (pointer)&type.field_2;
    sVar11 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&type,pcVar10,pcVar10 + sVar11);
    cmsys::SystemTools::UpperCase(&configUpper,config);
    if ((type._M_string_length != 0) && (configUpper._M_string_length != 0)) {
      pPVar2 = &ge.Backtrace.Bottom.Position.Position;
      ge.Backtrace.Bottom.State = (cmState *)pPVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ge,type._M_dataplus._M_p,type._M_dataplus._M_p + type._M_string_length);
      std::__cxx11::string::append((char *)&ge);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&ge,(ulong)configUpper._M_dataplus._M_p);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        lVar4 = *plVar13;
        lVar6 = plVar9[3];
        outName.field_2._M_local_buf[0] = (char)lVar4;
        outName.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar4 >> 8);
        outName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
        outName.field_2._8_3_ = (undefined3)lVar6;
        outName.field_2._M_local_buf[0xb] = (char)((ulong)lVar6 >> 0x18);
        outName.field_2._12_4_ = (undefined4)((ulong)lVar6 >> 0x20);
        outName._M_dataplus._M_p = (pointer)&outName.field_2;
      }
      else {
        lVar4 = *plVar13;
        outName.field_2._M_local_buf[0] = (char)lVar4;
        outName.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar4 >> 8);
        outName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
        outName._M_dataplus._M_p = (pointer)*plVar9;
      }
      outName._M_string_length = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != &outName.field_2) {
        operator_delete(outName._M_dataplus._M_p,
                        CONCAT17(outName.field_2._M_local_buf[7],
                                 CONCAT61(outName.field_2._M_allocated_capacity._1_6_,
                                          outName.field_2._M_local_buf[0])) + 1);
      }
      if (ge.Backtrace.Bottom.State != (cmState *)pPVar2) {
        operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1);
      }
    }
    if (type._M_string_length != 0) {
      outName._M_dataplus._M_p = (pointer)&outName.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&outName,type._M_dataplus._M_p,
                 type._M_dataplus._M_p + type._M_string_length);
      std::__cxx11::string::append((char *)&outName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != &outName.field_2) {
        operator_delete(outName._M_dataplus._M_p,
                        CONCAT17(outName.field_2._M_local_buf[7],
                                 CONCAT61(outName.field_2._M_allocated_capacity._1_6_,
                                          outName.field_2._M_local_buf[0])) + 1);
      }
    }
    if (configUpper._M_string_length != 0) {
      std::operator+(&outName,"OUTPUT_NAME_",&configUpper);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      paVar1 = &outName.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != paVar1) {
        operator_delete(outName._M_dataplus._M_p,
                        CONCAT17(outName.field_2._M_local_buf[7],
                                 CONCAT61(outName.field_2._M_allocated_capacity._1_6_,
                                          outName.field_2._M_local_buf[0])) + 1);
      }
      outName._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&outName,configUpper._M_dataplus._M_p,
                 configUpper._M_dataplus._M_p + configUpper._M_string_length);
      std::__cxx11::string::append((char *)&outName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outName._M_dataplus._M_p != paVar1) {
        operator_delete(outName._M_dataplus._M_p,
                        CONCAT17(outName.field_2._M_local_buf[7],
                                 CONCAT61(outName.field_2._M_allocated_capacity._1_6_,
                                          outName.field_2._M_local_buf[0])) + 1);
      }
    }
    paVar1 = &outName.field_2;
    outName.field_2._M_local_buf[0] = 'O';
    outName.field_2._M_allocated_capacity._1_6_ = 0x5f5455505455;
    outName.field_2._7_4_ = 0x454d414e;
    outName._M_string_length = 0xb;
    outName.field_2._M_local_buf[0xb] = '\0';
    outName._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outName._M_dataplus._M_p != paVar1) {
      operator_delete(outName._M_dataplus._M_p,
                      CONCAT17(outName.field_2._M_local_buf[7],
                               CONCAT61(outName.field_2._M_allocated_capacity._1_6_,
                                        outName.field_2._M_local_buf[0])) + 1);
    }
    outName._M_string_length = 0;
    outName.field_2._M_local_buf[0] = '\0';
    outName._M_dataplus._M_p = (pointer)paVar1;
    for (prop = props.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        prop != props.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; prop = prop + 1) {
      pcVar10 = GetProperty(this,prop);
      sVar7 = outName._M_string_length;
      if (pcVar10 != (char *)0x0) {
        strlen(pcVar10);
        std::__cxx11::string::_M_replace((ulong)&outName,0,(char *)sVar7,(ulong)pcVar10);
        break;
      }
    }
    if (outName._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&outName);
    }
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_c8);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)local_c8);
    local_a8 = __return_storage_ptr__;
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c8);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)&ge);
    cge.x_ = (cmCompiledGeneratorExpression *)local_c8._0_8_;
    local_c8._0_8_ = (cmState *)0x0;
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_c8);
    local_c8._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_c8[0x10] = '\0';
    local_c8._0_8_ = (cmState *)(local_c8 + 0x10);
    pcVar10 = cmCompiledGeneratorExpression::Evaluate
                        (cge.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                         (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                         (string *)local_c8);
    p_Var5 = _Var8._M_node[2]._M_left;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace
              ((ulong)&_Var8._M_node[2]._M_parent,0,(char *)p_Var5,(ulong)pcVar10);
    __return_storage_ptr__ = local_a8;
    if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
    }
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outName._M_dataplus._M_p != &outName.field_2) {
      operator_delete(outName._M_dataplus._M_p,
                      CONCAT17(outName.field_2._M_local_buf[7],
                               CONCAT61(outName.field_2._M_allocated_capacity._1_6_,
                                        outName.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
      operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)type._M_dataplus._M_p != &type.field_2) {
      operator_delete(type._M_dataplus._M_p,type.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)entry.second._M_dataplus._M_p != &entry.second.field_2) {
      operator_delete(entry.second._M_dataplus._M_p,entry.second.field_2._M_allocated_capacity + 1);
    }
    type.field_2._M_allocated_capacity = entry.first.first.field_2._M_allocated_capacity;
    _Var14._M_p = entry.first.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)entry.first.first._M_dataplus._M_p == &entry.first.first.field_2) goto LAB_0048d739;
  }
  else {
    if (_Var8._M_node[2]._M_left != (_Base_ptr)0x0) goto LAB_0048d739;
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::operator+(&type,"Target \'",&this->Target->Name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&type);
    paVar1 = &entry.first.first.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar12) {
      entry.first.first.field_2._M_allocated_capacity = *psVar12;
      entry.first.first.field_2._8_8_ = plVar9[3];
      entry.first.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      entry.first.first.field_2._M_allocated_capacity = *psVar12;
      entry.first.first._M_dataplus._M_p = (pointer)*plVar9;
    }
    entry.first.first._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    r = cmTarget::GetBacktrace(this->Target);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&configUpper,r);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&entry,(cmListFileBacktrace *)&configUpper);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&configUpper);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)entry.first.first._M_dataplus._M_p != paVar1) {
      operator_delete(entry.first.first._M_dataplus._M_p,
                      entry.first.first.field_2._M_allocated_capacity + 1);
    }
    _Var14._M_p = type._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)type._M_dataplus._M_p == &type.field_2) goto LAB_0048d739;
  }
  operator_delete(_Var14._M_p,type.field_2._M_allocated_capacity + 1);
LAB_0048d739:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,_Var8._M_node[2]._M_parent,
             (long)&(_Var8._M_node[2]._M_parent)->_M_color +
             (long)&(_Var8._M_node[2]._M_left)->_M_color);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)key.first._M_dataplus._M_p != &key.first.field_2) {
    operator_delete(key.first._M_dataplus._M_p,key.first.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetOutputName(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Lookup/compute/cache the output name for this configuration.
  OutputNameKey key(config, artifact);
  cmGeneratorTarget::OutputNameMapType::iterator i =
    this->OutputNameMap.find(key);
  if (i == this->OutputNameMap.end()) {
    // Add empty name in map to detect potential recursion.
    OutputNameMapType::value_type entry(key, "");
    i = this->OutputNameMap.insert(entry).first;

    // Compute output name.
    std::vector<std::string> props;
    std::string type = this->GetOutputTargetType(artifact);
    std::string configUpper = cmSystemTools::UpperCase(config);
    if (!type.empty() && !configUpper.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
      props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
    if (!type.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
      props.push_back(type + "_OUTPUT_NAME");
    }
    if (!configUpper.empty()) {
      // OUTPUT_NAME_<CONFIG>
      props.push_back("OUTPUT_NAME_" + configUpper);
      // <CONFIG>_OUTPUT_NAME
      props.push_back(configUpper + "_OUTPUT_NAME");
    }
    // OUTPUT_NAME
    props.push_back("OUTPUT_NAME");

    std::string outName;
    for (std::vector<std::string>::const_iterator it = props.begin();
         it != props.end(); ++it) {
      if (const char* outNameProp = this->GetProperty(*it)) {
        outName = outNameProp;
        break;
      }
    }

    if (outName.empty()) {
      outName = this->GetName();
    }

    // Now evaluate genex and update the previously-prepared map entry.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(outName);
    i->second = cge->Evaluate(this->LocalGenerator, config);
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_NAME depends on itself.",
      this->GetBacktrace());
  }
  return i->second;
}